

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

RecyclableObject *
Js::JavascriptArray::ArraySpeciesCreate<unsigned_int>
          (Var originalArray,uint length,ScriptContext *scriptContext,bool *pIsIntArray,
          bool *pIsFloatArray,bool *pIsBuiltinArrayCtor)

{
  code *pcVar1;
  anon_class_40_5_c40fc4e1 implicitCall;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  ThreadContext *pTVar5;
  DynamicType *this;
  PathTypeHandlerBase *this_00;
  DynamicObject *pDVar6;
  DynamicObject *pDVar7;
  RecyclableObject *pRVar8;
  ScriptContext *this_01;
  JavascriptLibrary *this_02;
  CallInfo CVar9;
  CallInfo CVar10;
  CallInfo CVar11;
  JavascriptArray *this_03;
  undefined4 *puVar12;
  Var aValue;
  Var scObject;
  ThreadContext *threadContext;
  CallInfo constructorCallInfo;
  Var constructorArgs [2];
  JavascriptArray *pArr;
  ScriptContext *constructorScriptContext;
  BOOL getProp;
  BOOL isArray;
  Var constructor;
  DynamicTypeHandler *local_88;
  DynamicTypeHandler *typeHandler;
  DynamicObject *dynamicObject;
  JavascriptLibrary *library;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  bool *pIsBuiltinArrayCtor_local;
  bool *pIsFloatArray_local;
  bool *pIsIntArray_local;
  ScriptContext *scriptContext_local;
  Var pvStack_18;
  uint length_local;
  Var originalArray_local;
  
  if (originalArray == (Var)0x0) {
    return (RecyclableObject *)0x0;
  }
  jsReentLock._24_8_ = pIsBuiltinArrayCtor;
  pIsIntArray_local = (bool *)scriptContext;
  scriptContext_local._4_4_ = length;
  pvStack_18 = originalArray;
  pTVar5 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_60,pTVar5);
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,pvStack_18);
  dynamicObject = (DynamicObject *)ScriptContext::GetLibrary((ScriptContext *)pIsIntArray_local);
  bVar2 = IsNonES5Array(pvStack_18);
  if (bVar2) {
    typeHandler = (DynamicTypeHandler *)UnsafeVarTo<Js::DynamicObject>(pvStack_18);
    this = DynamicObject::GetDynamicType((DynamicObject *)typeHandler);
    local_88 = DynamicType::GetTypeHandler(this);
    iVar3 = (*local_88->_vptr_DynamicTypeHandler[0x4e])();
    if (iVar3 != 0) {
      this_00 = PathTypeHandlerBase::FromTypeHandler(local_88);
      bVar2 = PathTypeHandlerBase::HasUserDefinedCtor(this_00);
      if (!bVar2) {
        pDVar6 = (DynamicObject *)RecyclableObject::GetPrototype((RecyclableObject *)typeHandler);
        pDVar7 = JavascriptLibraryBase::GetArrayPrototype((JavascriptLibraryBase *)dynamicObject);
        if ((pDVar6 == pDVar7) &&
           (bVar2 = JavascriptLibrary::GetArrayObjectHasUserDefinedSpecies
                              ((JavascriptLibrary *)dynamicObject), !bVar2)) {
          originalArray_local = (Var)0x0;
          goto LAB_010f8da5;
        }
      }
    }
  }
  _getProp = (CallInfo)JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)dynamicObject);
  JsReentLock::unlock((JsReentLock *)local_60);
  bVar2 = Js::JavascriptOperators::IsArray(pvStack_18);
  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  JsReentLock::relock((JsReentLock *)local_60);
  if (bVar2) {
    JsReentLock::unlock((JsReentLock *)local_60);
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvStack_18);
    BVar4 = Js::JavascriptOperators::GetProperty
                      (pRVar8,0x67,(Var *)&getProp,(ScriptContext *)pIsIntArray_local,
                       (PropertyValueInfo *)0x0);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    JsReentLock::relock((JsReentLock *)local_60);
    if (BVar4 == 0) {
      originalArray_local = (Var)0x0;
      goto LAB_010f8da5;
    }
    bVar2 = Js::JavascriptOperators::IsConstructor((Var)_getProp);
    if (bVar2) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>((Var)_getProp);
      this_01 = RecyclableObject::GetScriptContext(pRVar8);
      if (this_01 != (ScriptContext *)pIsIntArray_local) {
        this_02 = ScriptContext::GetLibrary(this_01);
        CVar11 = (CallInfo)
                 JavascriptLibraryBase::GetArrayConstructor(&this_02->super_JavascriptLibraryBase);
        if (CVar11 == _getProp) {
          _getProp = (CallInfo)
                     JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)dynamicObject);
        }
      }
    }
    BVar4 = Js::JavascriptOperators::IsObject((Var)_getProp);
    if (BVar4 != 0) {
      JsReentLock::unlock((JsReentLock *)local_60);
      BVar4 = Js::JavascriptOperators::GetProperty
                        ((RecyclableObject *)_getProp,0x19,(Var *)&getProp,
                         (ScriptContext *)pIsIntArray_local,(PropertyValueInfo *)0x0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      JsReentLock::relock((JsReentLock *)local_60);
      CVar11 = _getProp;
      if (BVar4 == 0) {
        if (jsReentLock._24_8_ != 0) {
          *(undefined1 *)jsReentLock._24_8_ = 0;
        }
        originalArray_local = (Var)0x0;
        goto LAB_010f8da5;
      }
      CVar9 = (CallInfo)JavascriptLibraryBase::GetNull((JavascriptLibraryBase *)dynamicObject);
      if (CVar11 == CVar9) {
        _getProp = (CallInfo)
                   JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)dynamicObject);
      }
    }
  }
  CVar11 = _getProp;
  CVar10 = (CallInfo)JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)dynamicObject);
  CVar9 = _getProp;
  if ((CVar11 == CVar10) ||
     (CVar11 = (CallInfo)
               JavascriptLibraryBase::GetArrayConstructor((JavascriptLibraryBase *)dynamicObject),
     CVar9 == CVar11)) {
    if (pIsIntArray == (bool *)0x0) {
      originalArray_local =
           JavascriptLibrary::CreateArray
                     ((JavascriptLibrary *)dynamicObject,scriptContext_local._4_4_);
    }
    else {
      this_03 = VarTo<Js::JavascriptArray>(pvStack_18);
      GetArrayTypeAndConvert(this_03,pIsIntArray,pIsFloatArray);
      originalArray_local =
           CreateNewArrayHelper
                     (scriptContext_local._4_4_,(bool)(*pIsIntArray & 1),(bool)(*pIsFloatArray & 1),
                      this_03,(ScriptContext *)pIsIntArray_local);
    }
  }
  else {
    bVar2 = Js::JavascriptOperators::IsConstructor((Var)_getProp);
    if (!bVar2) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)pIsIntArray_local,-0x7ff5ec00,L"constructor[Symbol.species]");
    }
    if (jsReentLock._24_8_ != 0) {
      *(undefined1 *)jsReentLock._24_8_ = 0;
    }
    constructorCallInfo = _getProp;
    JavascriptNumber::ToVar(scriptContext_local._4_4_,(ScriptContext *)pIsIntArray_local);
    CallInfo::CallInfo((CallInfo *)&threadContext,CallFlags_New,2);
    bVar2 = VarIs<Js::RecyclableObject>((Var)_getProp);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x30a7,"(Js::VarIs<Js::RecyclableObject>(constructor))",
                                  "Js::VarIs<Js::RecyclableObject>(constructor)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)pIsIntArray_local);
    implicitCall.constructor = (Var *)&getProp;
    implicitCall.jsReentLock = (JsReentLock *)local_60;
    implicitCall.constructorCallInfo = (CallInfo *)&threadContext;
    implicitCall.constructorArgs = (Var (*) [2])&constructorCallInfo;
    implicitCall.scriptContext = (ScriptContext **)&pIsIntArray_local;
    aValue = ThreadContext::
             ExecuteImplicitCall<Js::JavascriptArray::ArraySpeciesCreate<unsigned_int>(void*,unsigned_int,Js::ScriptContext*,bool*,bool*,bool*)::_lambda()_1_>
                       (pTVar5,(RecyclableObject *)_getProp,ImplicitCall_Accessor,implicitCall);
    originalArray_local = VarTo<Js::RecyclableObject>(aValue);
  }
LAB_010f8da5:
  constructor._4_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_60);
  return (RecyclableObject *)originalArray_local;
}

Assistant:

RecyclableObject*
    JavascriptArray::ArraySpeciesCreate(Var originalArray, T length, ScriptContext* scriptContext, bool *pIsIntArray, bool *pIsFloatArray, bool *pIsBuiltinArrayCtor)
    {
        if (originalArray == nullptr)
        {
            return nullptr;
        }

        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, originalArray);

        auto* library = scriptContext->GetLibrary();

        if (JavascriptArray::IsNonES5Array(originalArray))
        {
            auto* dynamicObject = UnsafeVarTo<DynamicObject>(originalArray);
            auto* typeHandler = dynamicObject->GetDynamicType()->GetTypeHandler();

            if (typeHandler->IsPathTypeHandler()
                && !PathTypeHandlerBase::FromTypeHandler(typeHandler)->HasUserDefinedCtor()
                && dynamicObject->GetPrototype() == library->GetArrayPrototype()
                && !library->GetArrayObjectHasUserDefinedSpecies())
            {
                return nullptr;
            }
        }

        Var constructor = library->GetUndefined();

        JS_REENTRANT(jsReentLock, BOOL isArray = JavascriptOperators::IsArray(originalArray));
        if (isArray)
        {
            JS_REENTRANT(jsReentLock, BOOL getProp = JavascriptOperators::GetProperty(UnsafeVarTo<RecyclableObject>(originalArray), PropertyIds::constructor, &constructor, scriptContext));
            if (!getProp)
            {
                return nullptr;
            }

            if (JavascriptOperators::IsConstructor(constructor))
            {
                ScriptContext* constructorScriptContext = UnsafeVarTo<RecyclableObject>(constructor)->GetScriptContext();
                if (constructorScriptContext != scriptContext)
                {
                    if (constructorScriptContext->GetLibrary()->GetArrayConstructor() == constructor)
                    {
                        constructor = library->GetUndefined();
                    }
                }
            }

            if (JavascriptOperators::IsObject(constructor))
            {
                JS_REENTRANT(jsReentLock, getProp = JavascriptOperators::GetProperty((RecyclableObject*)constructor, PropertyIds::_symbolSpecies, &constructor, scriptContext));
                if (!getProp)
                {
                    if (pIsBuiltinArrayCtor != nullptr)
                    {
                        *pIsBuiltinArrayCtor = false;
                    }
                    return nullptr;
                }
                if (constructor == library->GetNull())
                {
                    constructor = library->GetUndefined();
                }
            }
        }

        if (constructor == library->GetUndefined() || constructor == library->GetArrayConstructor())
        {
            if (length > UINT_MAX)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }

            if (nullptr == pIsIntArray)
            {
                return library->CreateArray(static_cast<uint32>(length));
            }
            else
            {
                // If the constructor function is the built-in Array constructor, we can be smart and create the right type of native array.
                JavascriptArray* pArr = VarTo<JavascriptArray>(originalArray);
                pArr->GetArrayTypeAndConvert(pIsIntArray, pIsFloatArray);
                return CreateNewArrayHelper(static_cast<uint32>(length), *pIsIntArray, *pIsFloatArray, pArr, scriptContext);
            }
        }

        if (!JavascriptOperators::IsConstructor(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor, _u("constructor[Symbol.species]"));
        }

        if (pIsBuiltinArrayCtor != nullptr)
        {
            *pIsBuiltinArrayCtor = false;
        }

        Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(length, scriptContext) };
        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));

        AssertOrFailFast(Js::VarIs<Js::RecyclableObject>(constructor));
        ThreadContext* threadContext = scriptContext->GetThreadContext();
        Var scObject = threadContext->ExecuteImplicitCall((RecyclableObject*)constructor, ImplicitCall_Accessor, [&]()->Js::Var
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptOperators::NewScObject(constructor, Js::Arguments(constructorCallInfo, constructorArgs), scriptContext));
        });
        return VarTo<RecyclableObject>(scObject);
    }